

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O2

void __thiscall UnitTest_parser28::Run(UnitTest_parser28 *this)

{
  allocator local_39;
  long *local_38;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"for a.b = 1, 2 do end",&local_39);
  anon_unknown.dwarf_6bcd::Parse((anon_unknown_dwarf_6bcd *)&local_38,&local_30);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  local_38 = (long *)0x0;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string
            ((string *)&local_30,
             "\'{ Parse(\"for a.b = 1, 2 do end\"); }\' has no luna::ParseException",&local_39);
  UnitTestBase::Error(&this->super_UnitTestBase,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

TEST_CASE(parser28)
{
    EXPECT_EXCEPTION(luna::ParseException,
                     {
                         Parse("for a.b = 1, 2 do end");
                     });
}